

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
          *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char16_t *pcVar5;
  QAbstractConcatenable *pQVar6;
  QString *pQVar7;
  QChar *in_RCX;
  char16_t *pcVar8;
  QLatin1StringView in;
  QLatin1StringView in_00;
  
  if (((((this->a).a.a.m_data == (char *)0x0) && ((((this->a).a.b)->d).ptr == (char16_t *)0x0)) &&
      ((this->a).b.m_data == (char *)0x0)) && ((this->b).d.ptr == (char16_t *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = (((this->a).a.b)->d).size;
    lVar2 = (this->a).a.a.m_size;
    lVar3 = (this->a).b.m_size;
    lVar4 = (this->b).d.size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + lVar2 + lVar3 + lVar4,Uninitialized);
    pcVar5 = (__return_storage_ptr__->d).ptr;
    pQVar6 = (QAbstractConcatenable *)(this->a).a.a.m_size;
    in.m_data = (char *)pcVar5;
    in.m_size = (qsizetype)(this->a).a.a.m_data;
    QAbstractConcatenable::appendLatin1To(pQVar6,in,in_RCX);
    pcVar5 = pcVar5 + (long)pQVar6;
    pQVar7 = (this->a).a.b;
    lVar1 = (pQVar7->d).size;
    if (lVar1 != 0) {
      pcVar8 = (pQVar7->d).ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = L"";
      }
      memcpy(pcVar5,pcVar8,lVar1 * 2);
    }
    pQVar6 = (QAbstractConcatenable *)(this->a).b.m_size;
    in_00.m_data = (char *)(pcVar5 + lVar1);
    in_00.m_size = (qsizetype)(this->a).b.m_data;
    QAbstractConcatenable::appendLatin1To(pQVar6,in_00,in_RCX);
    lVar2 = (this->b).d.size;
    if (lVar2 != 0) {
      pcVar8 = (this->b).d.ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = L"";
      }
      memcpy(pcVar5 + lVar1 + (long)pQVar6,pcVar8,lVar2 * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }